

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::BVH::query(BVH *this,AABB *queryAabb,Array<unsigned_int> *result)

{
  Array<xatlas::internal::AABB> *this_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t index;
  Node *pNVar3;
  uint *puVar4;
  AABB *other;
  int iVar5;
  uint32_t right;
  uint32_t left;
  uint32_t obj;
  uint32_t o;
  Node *node;
  int ni;
  int32_t stackptr;
  uint32_t todo [64];
  Array<unsigned_int> *result_local;
  AABB *queryAabb_local;
  BVH *this_local;
  
  Array<unsigned_int>::clear(result);
  node._4_4_ = 0;
  ni = 0;
  while (-1 < node._4_4_) {
    iVar5 = node._4_4_ + -1;
    uVar2 = (&ni)[node._4_4_];
    pNVar3 = Array<xatlas::internal::BVH::Node>::operator[](&this->m_nodes,uVar2);
    if (pNVar3->rightOffset == 0) {
      for (left = 0; node._4_4_ = iVar5, left < pNVar3->nPrims; left = left + 1) {
        uVar2 = pNVar3->start + left;
        this_00 = this->m_objectAabbs;
        puVar4 = Array<unsigned_int>::operator[](&this->m_objectIds,uVar2);
        other = Array<xatlas::internal::AABB>::operator[](this_00,*puVar4);
        bVar1 = AABB::intersect(queryAabb,other);
        if (bVar1) {
          puVar4 = Array<unsigned_int>::operator[](&this->m_objectIds,uVar2);
          Array<unsigned_int>::push_back(result,puVar4);
        }
      }
    }
    else {
      index = uVar2 + pNVar3->rightOffset;
      pNVar3 = Array<xatlas::internal::BVH::Node>::operator[](&this->m_nodes,uVar2 + 1);
      bVar1 = AABB::intersect(queryAabb,&pNVar3->aabb);
      if (bVar1) {
        (&ni)[node._4_4_] = uVar2 + 1;
        iVar5 = node._4_4_;
      }
      node._4_4_ = iVar5;
      pNVar3 = Array<xatlas::internal::BVH::Node>::operator[](&this->m_nodes,index);
      bVar1 = AABB::intersect(queryAabb,&pNVar3->aabb);
      if (bVar1) {
        (&ni)[node._4_4_ + 1] = index;
        node._4_4_ = node._4_4_ + 1;
      }
    }
  }
  return;
}

Assistant:

void query(const AABB &queryAabb, Array<uint32_t> &result) const
	{
		result.clear();
		// Working set
		uint32_t todo[64];
		int32_t stackptr = 0;
		// "Push" on the root node to the working set
		todo[stackptr] = 0;
		while(stackptr >= 0) {
			// Pop off the next node to work on.
			const int ni = todo[stackptr--];
			const Node &node = m_nodes[ni];
			// Is leaf -> Intersect
			if (node.rightOffset == 0) {
				for(uint32_t o = 0; o < node.nPrims; ++o) {
					const uint32_t obj = node.start + o;
					if (queryAabb.intersect((*m_objectAabbs)[m_objectIds[obj]]))
						result.push_back(m_objectIds[obj]);
				}
			} else { // Not a leaf
				const uint32_t left = ni + 1;
				const uint32_t right = ni + node.rightOffset;
				if (queryAabb.intersect(m_nodes[left].aabb))
					todo[++stackptr] = left;
				if (queryAabb.intersect(m_nodes[right].aabb))
					todo[++stackptr] = right;
			}
		}
	}